

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.h
# Opt level: O3

bool __thiscall
FastPForLib::CSVFlatFile::nextRow<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (CSVFlatFile *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *container)

{
  string *str;
  char cVar1;
  istream *piVar2;
  mapped_type *pmVar3;
  pointer pbVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  piVar2 = (this->mainreader).mIn;
  str = &(this->mainreader).line;
  cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar2 + -0x18) + (char)piVar2);
  piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     (piVar2,(string *)str,cVar1);
  if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
    do {
      if (((this->mainreader).line._M_string_length != 0) &&
         (*(this->mainreader).line._M_dataplus._M_p != (this->mainreader).mCommentMarker)) {
        CSVReader::tokenize(&this->mainreader,str);
        pbVar4 = (this->mainreader).currentData.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->mainreader).currentData.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish == pbVar4) {
          return true;
        }
        lVar7 = 0;
        lVar5 = 0;
        uVar6 = 0;
        do {
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                 *)((long)&(((this->mapping).
                                             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                           _M_impl.field_0x0 + lVar5),
                                (key_type *)((long)&(pbVar4->_M_dataplus)._M_p + lVar7));
          lVar5 = lVar5 + 0x30;
          lVar7 = lVar7 + 0x20;
          (container->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar6] = (uint)*pmVar3;
          uVar6 = uVar6 + 1;
          pbVar4 = (this->mainreader).currentData.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar6 < (ulong)((long)(this->mainreader).currentData.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >>
                                5));
        return true;
      }
      piVar2 = (this->mainreader).mIn;
      cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar2 + -0x18) + (char)piVar2);
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (piVar2,(string *)str,cVar1);
    } while (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0);
  }
  return false;
}

Assistant:

bool nextRow(C &container) {
    if (mainreader.hasNext()) {
      const std::vector<std::string> &row = mainreader.nextRow();
      for (size_t k = 0; k < row.size(); ++k) {
        container[k] = static_cast<uint32_t>(mapping[k][row[k]]);
      }
      return true;
    } else
      return false;
  }